

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FC_BPNN.cpp
# Opt level: O1

void __thiscall FC_BPNN::FC_BPNN(FC_BPNN *this,int perceptronNum,...)

{
  long lVar1;
  undefined8 uVar2;
  char in_AL;
  uint *puVar3;
  Preceptron *this_00;
  mapped_type *ppPVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong uVar5;
  uint uVar6;
  size_t finder1;
  ulong uVar7;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar8;
  pointer pvVar9;
  FC_BPNN *pFVar10;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  vector<double,_std::allocator<double>_> layer_loss;
  vector<double,_std::allocator<double>_> layer_value;
  allocator_type local_181;
  FC_BPNN *local_180;
  ulong local_178;
  uint *local_170;
  undefined1 *local_168;
  vector<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
  *local_158;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_150;
  ulong local_148;
  vector<double,_std::allocator<double>_> local_140;
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Preceptron_*>,_std::_Select1st<std::pair<const_unsigned_long,_Preceptron_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
  local_128;
  ulong local_f8;
  undefined8 local_f0;
  undefined1 local_e8 [16];
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  local_168 = local_e8;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  (this->net).
  super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->net).
  super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->layers_error).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->layers_error).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->layers_value).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->layers_error).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->layers_value).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->layers_value).
  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->net).
  super__Vector_base<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_170 = (uint *)&stack0x00000008;
  local_178 = 0x3000000018;
  local_150 = &this->layers_error;
  local_158 = &this->net;
  local_d8._0_4_ = (uint)in_RDX;
  local_180 = this;
  uVar2 = in_RDX;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if (-1 < (int)(uint)local_d8) {
    uVar6 = (uint)local_d8;
    local_d8 = in_RDX;
    do {
      local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)&local_128,(ulong)uVar6,
                 (value_type *)&local_140,(allocator_type *)&local_f0);
      local_f0 = 0;
      std::vector<double,_std::allocator<double>_>::vector
                (&local_140,(ulong)uVar6,(value_type *)&local_f0,&local_181);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&local_180->layers_value,(vector<double,_std::allocator<double>_> *)&local_128);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(local_150,&local_140);
      uVar5 = local_178 & 0xffffffff;
      if (uVar5 < 0x29) {
        local_178 = CONCAT44(local_178._4_4_,(int)local_178 + 8);
        puVar3 = (uint *)(local_168 + uVar5);
      }
      else {
        puVar3 = local_170;
        local_170 = local_170 + 2;
      }
      uVar6 = *puVar3;
      if (local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if ((pointer)local_128._M_impl._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_128._M_impl._0_8_,
                        (long)local_128._M_impl.super__Rb_tree_header._M_header._M_parent -
                        local_128._M_impl._0_8_);
      }
      uVar2 = local_d8;
    } while (-1 < (int)uVar6);
  }
  local_d8 = uVar2;
  if (1 < (ulong)(((long)(local_180->layers_value).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_180->layers_value).
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
    uVar5 = 1;
    pFVar10 = local_180;
    do {
      local_128._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_128._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_128._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)((long)&local_128 + 8);
      local_128._M_impl.super__Rb_tree_header._M_node_count = 0;
      lVar1 = uVar5 - 1;
      pvVar9 = (pFVar10->layers_value).
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_148 = uVar5;
      local_128._M_impl.super__Rb_tree_header._M_header._M_right =
           local_128._M_impl.super__Rb_tree_header._M_header._M_left;
      if (pvVar9[lVar1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          *(pointer *)&pvVar9[lVar1].super__Vector_base<double,_std::allocator<double>_>._M_impl) {
        lVar8 = 0;
        uVar7 = 0;
        do {
          pvVar9 = (pFVar10->layers_value).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_f8 = uVar7;
          if (pvVar9[uVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              *(pointer *)&pvVar9[uVar5].super__Vector_base<double,_std::allocator<double>_>._M_impl
             ) {
            uVar7 = 0;
            do {
              local_140.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)(lVar8 + uVar7);
              this_00 = (Preceptron *)operator_new(0x98);
              memset(this_00,0,0x98);
              this_00->_vptr_Preceptron = (_func_int **)&PTR_Construct_00108d30;
              Preceptron::Construct
                        (this_00,(int)((ulong)((long)pvVar9[lVar1].
                                                                                                          
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                              *(long *)&pvVar9[lVar1].
                                                                                                                
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl) >> 3));
              ppPVar4 = std::
                        map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
                        ::operator[]((map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
                                      *)&local_128,(key_type *)&local_140);
              *ppPVar4 = this_00;
              uVar7 = uVar7 + 1;
              pvVar9 = (local_180->layers_value).
                       super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar7 < (ulong)((long)pvVar9[uVar5].
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl.super__Vector_impl_data._M_finish -
                                     *(long *)&pvVar9[uVar5].
                                               super__Vector_base<double,_std::allocator<double>_>.
                                               _M_impl >> 3));
          }
          pvVar9 = (local_180->layers_value).
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar7 = local_f8 + 1;
          lVar8 = lVar8 + 0x100000000;
          pFVar10 = local_180;
        } while (uVar7 < (ulong)((long)pvVar9[lVar1].
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_finish -
                                 *(long *)&pvVar9[lVar1].
                                           super__Vector_base<double,_std::allocator<double>_>.
                                           _M_impl >> 3));
      }
      std::
      vector<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>,_std::allocator<std::map<unsigned_long,_Preceptron_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>_>_>
      ::push_back(local_158,(value_type *)&local_128);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_Preceptron_*>,_std::_Select1st<std::pair<const_unsigned_long,_Preceptron_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Preceptron_*>_>_>
      ::~_Rb_tree(&local_128);
      uVar5 = local_148 + 1;
      uVar7 = ((long)(pFVar10->layers_value).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(pFVar10->layers_value).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
    } while (uVar5 <= uVar7 && uVar7 - uVar5 != 0);
  }
  return;
}

Assistant:

FC_BPNN::FC_BPNN(int perceptronNum, ...)
{
	va_list ap;
	va_start(ap, 0);
	int num = va_arg(ap, int);
	while (num > -1)
	{
		std::vector<double> layer_value(num, 0.0);
		std::vector<double> layer_loss(num, 0.0);
		layers_value.push_back(layer_value);
		layers_error.push_back(layer_loss);
		num = va_arg(ap, int);
	}
	va_end(ap);

	for (int i = 1; i < layers_value.size(); i++) {
		std::map<size_t, Preceptron*> subNet;
		for (int j = 0; j < layers_value[i - 1].size(); j++) {
			for (int k = 0; k < layers_value[i].size(); k++) {
				size_t finder0 = j;
				size_t finder1 = k;
				size_t finder = (finder0 << 32) | finder1;
				auto ptr = dynamic_cast<Preceptron*>(new Preceptron_SIGMOID());
				ptr->Construct(layers_value[i - 1].size());
				subNet[finder] = ptr;
			}
		}
		net.push_back(subNet);
	}

}